

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTExecutionInfo.cpp
# Opt level: O0

FunctionBody * __thiscall
TTD::TTDebuggerSourceLocation::LoadFunctionBodyIfPossible
          (TTDebuggerSourceLocation *this,ScriptContext *inCtx)

{
  ULONG UVar1;
  ULONG UVar2;
  FunctionBody *rootBody;
  ScriptContext *inCtx_local;
  TTDebuggerSourceLocation *this_local;
  
  this_local = (TTDebuggerSourceLocation *)
               ScriptContextTTD::FindRootBodyByTopLevelCtr
                         (inCtx->TTDContextInfo,this->m_topLevelBodyId);
  if ((FunctionBody *)this_local == (FunctionBody *)0x0) {
    this_local = (TTDebuggerSourceLocation *)0x0;
  }
  else {
    UVar1 = this->m_functionLine;
    UVar2 = Js::ParseableFunctionInfo::GetLineNumber((ParseableFunctionInfo *)this_local);
    if ((UVar1 != UVar2) ||
       (UVar1 = this->m_functionColumn,
       UVar2 = Js::ParseableFunctionInfo::GetColumnNumber((ParseableFunctionInfo *)this_local),
       UVar1 != UVar2)) {
      this_local = (TTDebuggerSourceLocation *)
                   UpdatePostInflateFunctionBody_Helper(this,(FunctionBody *)this_local);
    }
  }
  return (FunctionBody *)this_local;
}

Assistant:

Js::FunctionBody* TTDebuggerSourceLocation::LoadFunctionBodyIfPossible(Js::ScriptContext* inCtx) const
    {
        Js::FunctionBody* rootBody = inCtx->TTDContextInfo->FindRootBodyByTopLevelCtr(this->m_topLevelBodyId);
        if(rootBody == nullptr)
        {
            return nullptr;
        }

        if(this->m_functionLine == rootBody->GetLineNumber() && this->m_functionColumn == rootBody->GetColumnNumber())
        {
            return rootBody;
        }
        else
        {
            return this->UpdatePostInflateFunctionBody_Helper(rootBody);
        }
    }